

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phoenix_flm.cpp
# Opt level: O0

void __thiscall
phoenix_flm_t::flm_entry_t::flm_entry_t
          (flm_entry_t *this,kstream *p__io,phoenix_flm_t *p__parent,phoenix_flm_t *p__root)

{
  phoenix_flm_t *p__root_local;
  phoenix_flm_t *p__parent_local;
  kstream *p__io_local;
  flm_entry_t *this_local;
  
  kaitai::kstruct::kstruct(&this->super_kstruct,p__io);
  (this->super_kstruct)._vptr_kstruct = (_func_int **)&PTR__flm_entry_t_002700d0;
  std::__cxx11::string::string((string *)&this->m_guid);
  this->m__parent = p__parent;
  this->m__root = p__root;
  _read(this);
  return;
}

Assistant:

phoenix_flm_t::flm_entry_t::flm_entry_t(kaitai::kstream* p__io, phoenix_flm_t* p__parent, phoenix_flm_t* p__root) : kaitai::kstruct(p__io) {
    m__parent = p__parent;
    m__root = p__root;
    _read();
}